

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
pstore::json::details::object_matcher<pstore::exchange::import_ns::callbacks>::end_object
          (object_matcher<pstore::exchange::import_ns::callbacks> *this,
          parser<pstore::exchange::import_ns::callbacks> *parser)

{
  callbacks *this_00;
  error_code eVar1;
  error_code local_28;
  parser<pstore::exchange::import_ns::callbacks> *local_18;
  parser<pstore::exchange::import_ns::callbacks> *parser_local;
  object_matcher<pstore::exchange::import_ns::callbacks> *this_local;
  
  local_18 = parser;
  parser_local = (parser<pstore::exchange::import_ns::callbacks> *)this;
  this_00 = parser<pstore::exchange::import_ns::callbacks>::callbacks(parser);
  eVar1 = exchange::import_ns::callbacks::end_object(this_00);
  local_28._M_cat = eVar1._M_cat;
  local_28._M_value = eVar1._M_value;
  matcher<pstore::exchange::import_ns::callbacks>::set_error
            (&this->super_matcher<pstore::exchange::import_ns::callbacks>,parser,&local_28);
  matcher<pstore::exchange::import_ns::callbacks>::set_state
            (&this->super_matcher<pstore::exchange::import_ns::callbacks>,1);
  return;
}

Assistant:

void object_matcher<Callbacks>::end_object (parser<Callbacks> & parser) {
                this->set_error (parser, parser.callbacks ().end_object ());
                this->set_state (done_state);
            }